

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzx_compress.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  undefined1 local_50 [8];
  string raw;
  string compressed;
  
  if (argc == 3) {
    local_50 = (undefined1  [8])&raw._M_string_length;
    raw._M_dataplus._M_p = (pointer)0x0;
    raw._M_string_length._0_1_ = 0;
    bVar1 = mg::fs::read_file(argv[1],(string *)local_50);
    if (bVar1) {
      raw.field_2._8_8_ = &compressed._M_string_length;
      compressed._M_dataplus._M_p = (pointer)0x0;
      compressed._M_string_length._0_1_ = 0;
      bVar1 = mg::data::mzx_compress((string *)local_50,(string *)((long)&raw.field_2 + 8),true);
      if (bVar1) {
        bVar1 = mg::fs::write_file(argv[2],(string *)((long)&raw.field_2 + 8));
        iVar2 = bVar1 - 1;
      }
      else {
        fwrite("Compress failed\n",0x10,1,_stderr);
        iVar2 = -1;
      }
      std::__cxx11::string::~string((string *)(raw.field_2._M_local_buf + 8));
    }
    else {
      iVar2 = -1;
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    fprintf(_stderr,"%s infile outfile\n",*argv);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 3) {
    fprintf(stderr, "%s infile outfile\n", argv[0]);
    return -1;
  }

  // Read input file
  std::string raw;
  if (!mg::fs::read_file(argv[1], raw)) {
    return -1;
  }

  // Decompress
  std::string compressed;
  if (!mg::data::mzx_compress(raw, compressed)) {
    fprintf(stderr, "Compress failed\n");
    return -1;
  }

  // Emit
  if (!mg::fs::write_file(argv[2], compressed)) {
    return -1;
  }

  return 0;
}